

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupAppendNew(Gia_Man_t *pOne,Gia_Man_t *pTwo)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  uint uVar7;
  Gia_Man_t *p;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pVVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  
  p = Gia_ManStart(pTwo->nObjs + pOne->nObjs);
  pcVar3 = pOne->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
  }
  p->pName = pcVar9;
  pcVar3 = pOne->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
  }
  p->pSpec = pcVar9;
  Gia_ManHashAlloc(p);
  pOne->pObjs->Value = 0;
  if (1 < pOne->nObjs) {
    lVar16 = 1;
    lVar15 = 0x14;
    do {
      pGVar4 = pOne->pObjs;
      uVar13 = *(ulong *)((long)pGVar4 + lVar15 + -8);
      if ((uVar13 & 0x1fffffff) == 0x1fffffff || (int)(uint)uVar13 < 0) {
        if (((uint)uVar13 & 0x9fffffff) == 0x9fffffff) {
          pGVar10 = Gia_ManAppendObj(p);
          uVar13 = *(ulong *)pGVar10;
          *(ulong *)pGVar10 = uVar13 | 0x9fffffff;
          *(ulong *)pGVar10 =
               uVar13 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar5 = p->pObjs;
          if ((pGVar5 <= pGVar10) && (pGVar10 < pGVar5 + p->nObjs)) {
            Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * -0x55555555);
            pGVar5 = p->pObjs;
            if ((pGVar5 <= pGVar10) && (pGVar10 < pGVar5 + p->nObjs)) {
              iVar6 = (int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * 0x55555556;
              goto LAB_001dc46e;
            }
          }
          goto LAB_001dc976;
        }
      }
      else {
        uVar7 = *(uint *)((long)pGVar4 +
                         lVar15 + (ulong)(uint)((int)(uVar13 & 0x1fffffff) << 2) * -3);
        if (((int)uVar7 < 0) ||
           (uVar12 = *(uint *)((long)pGVar4 +
                              lVar15 + (ulong)((uint)(uVar13 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar12 < 0)) goto LAB_001dc938;
        iVar6 = Gia_ManHashAnd(p,uVar7 ^ (uint)(uVar13 >> 0x1d) & 1,
                               uVar12 ^ (uint)(uVar13 >> 0x3d) & 1);
LAB_001dc46e:
        *(int *)(&pGVar4->field_0x0 + lVar15) = iVar6;
      }
      lVar16 = lVar16 + 1;
      lVar15 = lVar15 + 0xc;
    } while (lVar16 < pOne->nObjs);
  }
  pTwo->pObjs->Value = 0;
  if (pTwo->nObjs < 2) {
LAB_001dc69e:
    Gia_ManHashStop(p);
    pVVar11 = pOne->vCos;
    uVar13 = (ulong)(uint)pVVar11->nSize;
    if (pOne->nRegs < pVVar11->nSize) {
      lVar15 = 0;
      do {
        if ((int)uVar13 <= lVar15) goto LAB_001dc957;
        iVar6 = pVVar11->pArray[lVar15];
        if (((long)iVar6 < 0) || (pOne->nObjs <= iVar6)) goto LAB_001dc919;
        if (pOne->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar4 = pOne->pObjs + iVar6;
        if ((int)pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value < 0)
        goto LAB_001dc938;
        uVar7 = Gia_ManAppendCo(p,(uint)*(undefined8 *)pGVar4 >> 0x1d & 1 ^
                                  pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value);
        pGVar4->Value = uVar7;
        lVar15 = lVar15 + 1;
        pVVar11 = pOne->vCos;
        uVar13 = (ulong)pVVar11->nSize;
      } while (lVar15 < (long)(uVar13 - (long)pOne->nRegs));
    }
    pVVar11 = pTwo->vCos;
    uVar13 = (ulong)(uint)pVVar11->nSize;
    if (pTwo->nRegs < pVVar11->nSize) {
      lVar15 = 0;
      do {
        if ((int)uVar13 <= lVar15) goto LAB_001dc957;
        iVar6 = pVVar11->pArray[lVar15];
        if (((long)iVar6 < 0) || (pTwo->nObjs <= iVar6)) goto LAB_001dc919;
        if (pTwo->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar4 = pTwo->pObjs + iVar6;
        if ((int)pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value < 0)
        goto LAB_001dc938;
        uVar7 = Gia_ManAppendCo(p,(uint)*(undefined8 *)pGVar4 >> 0x1d & 1 ^
                                  pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value);
        pGVar4->Value = uVar7;
        lVar15 = lVar15 + 1;
        pVVar11 = pTwo->vCos;
        uVar13 = (ulong)pVVar11->nSize;
      } while (lVar15 < (long)(uVar13 - (long)pTwo->nRegs));
    }
    iVar6 = pOne->nRegs;
    if (0 < iVar6) {
      iVar14 = 0;
      do {
        iVar2 = pOne->vCos->nSize;
        uVar7 = (iVar2 - iVar6) + iVar14;
        if (((int)uVar7 < 0) || (iVar2 <= (int)uVar7)) goto LAB_001dc957;
        iVar6 = pOne->vCos->pArray[uVar7];
        if (((long)iVar6 < 0) || (pOne->nObjs <= iVar6)) goto LAB_001dc919;
        if (pOne->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar4 = pOne->pObjs + iVar6;
        if ((int)pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value < 0)
        goto LAB_001dc938;
        uVar7 = Gia_ManAppendCo(p,(uint)*(undefined8 *)pGVar4 >> 0x1d & 1 ^
                                  pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value);
        pGVar4->Value = uVar7;
        iVar14 = iVar14 + 1;
        iVar6 = pOne->nRegs;
      } while (iVar14 < iVar6);
    }
    iVar6 = pTwo->nRegs;
    if (0 < iVar6) {
      iVar14 = 0;
      do {
        iVar2 = pTwo->vCos->nSize;
        uVar7 = (iVar2 - iVar6) + iVar14;
        if (((int)uVar7 < 0) || (iVar2 <= (int)uVar7)) {
LAB_001dc957:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = pTwo->vCos->pArray[uVar7];
        if (((long)iVar2 < 0) || (pTwo->nObjs <= iVar2)) {
LAB_001dc919:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (pTwo->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar4 = pTwo->pObjs + iVar2;
        if ((int)pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value < 0) {
LAB_001dc938:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar7 = Gia_ManAppendCo(p,(uint)*(undefined8 *)pGVar4 >> 0x1d & 1 ^
                                  pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value);
        pGVar4->Value = uVar7;
        iVar14 = iVar14 + 1;
        iVar6 = pTwo->nRegs;
      } while (iVar14 < iVar6);
    }
    Gia_ManSetRegNum(p,iVar6 + pOne->nRegs);
    return p;
  }
  lVar15 = 1;
  lVar16 = 0x14;
LAB_001dc4ad:
  pGVar4 = pTwo->pObjs;
  uVar13 = *(ulong *)((long)pGVar4 + lVar16 + -8);
  uVar7 = (uint)uVar13;
  uVar12 = (uint)(uVar13 >> 0x20);
  if ((uVar13 & 0x1fffffff) == 0x1fffffff || (int)uVar7 < 0) {
    if ((uVar7 & 0x9fffffff) != 0x9fffffff) goto LAB_001dc5c0;
    if ((int)(uVar12 & 0x1fffffff) < pTwo->vCis->nSize - pTwo->nRegs) {
      if (-1 < (int)uVar7) {
        __assert_fail("pObj->fTerm",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
      }
      iVar6 = pOne->vCis->nSize;
      if (iVar6 - pOne->nRegs <= (int)(uVar12 & 0x1fffffff)) {
        __assert_fail("v < Gia_ManPiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
      }
      if ((int)(uVar12 & 0x1fffffff) < iVar6) {
        iVar6 = pOne->vCis->pArray[uVar12 & 0x1fffffff];
        if ((-1 < (long)iVar6) && (iVar6 < pOne->nObjs)) {
          uVar7 = pOne->pObjs[iVar6].Value;
          goto LAB_001dc5bc;
        }
        goto LAB_001dc919;
      }
      goto LAB_001dc957;
    }
    pGVar10 = Gia_ManAppendObj(p);
    uVar13 = *(ulong *)pGVar10;
    *(ulong *)pGVar10 = uVar13 | 0x9fffffff;
    *(ulong *)pGVar10 =
         uVar13 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
    pGVar5 = p->pObjs;
    if ((pGVar10 < pGVar5) || (pGVar5 + p->nObjs <= pGVar10)) {
LAB_001dc976:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * -0x55555555);
    pGVar5 = p->pObjs;
    if ((pGVar10 < pGVar5) || (pGVar5 + p->nObjs <= pGVar10)) goto LAB_001dc976;
    uVar7 = (int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * 0x55555556;
  }
  else {
    uVar7 = *(uint *)((long)pGVar4 + lVar16 + (ulong)(uint)((int)(uVar13 & 0x1fffffff) << 2) * -3);
    if (((int)uVar7 < 0) ||
       (uVar1 = *(uint *)((long)pGVar4 + lVar16 + (ulong)((uint)(uVar13 >> 0x1e) & 0x7ffffffc) * -3)
       , (int)uVar1 < 0)) goto LAB_001dc938;
    uVar7 = Gia_ManHashAnd(p,uVar7 ^ (uint)(uVar13 >> 0x1d) & 1,uVar1 ^ uVar12 >> 0x1d & 1);
  }
LAB_001dc5bc:
  *(uint *)(&pGVar4->field_0x0 + lVar16) = uVar7;
LAB_001dc5c0:
  lVar15 = lVar15 + 1;
  lVar16 = lVar16 + 0xc;
  if (pTwo->nObjs <= lVar15) goto LAB_001dc69e;
  goto LAB_001dc4ad;
}

Assistant:

Gia_Man_t * Gia_ManDupAppendNew( Gia_Man_t * pOne, Gia_Man_t * pTwo )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(pOne) + Gia_ManObjNum(pTwo) );
    pNew->pName = Abc_UtilStrsav( pOne->pName );
    pNew->pSpec = Abc_UtilStrsav( pOne->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(pOne)->Value = 0;
    Gia_ManForEachObj1( pOne, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    Gia_ManConst0(pTwo)->Value = 0;
    Gia_ManForEachObj1( pTwo, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsPi(pTwo, pObj) )
            pObj->Value = Gia_ManPi(pOne, Gia_ObjCioId(pObj))->Value;
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    Gia_ManHashStop( pNew );
    // primary outputs
    Gia_ManForEachPo( pOne, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachPo( pTwo, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // flop inputs
    Gia_ManForEachRi( pOne, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachRi( pTwo, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(pOne) + Gia_ManRegNum(pTwo) );
    return pNew;
}